

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OCVWarp.cpp
# Opt level: O2

void update_map(double anglex,double angley,Mat *map_x,Mat *map_y,int transformtype)

{
  uint uVar1;
  uint uVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  ulong uVar6;
  ulong uVar7;
  int j;
  int iVar8;
  ulong uVar9;
  long lVar10;
  int j_1;
  int iVar11;
  Mat *pMVar12;
  ulong uVar13;
  Mat *pMVar14;
  long lVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  float local_760;
  float local_748;
  string local_6a8;
  int local_688;
  int local_684;
  int local_680;
  int local_67c;
  _OutputArray local_678 [4];
  Mat local_618 [96];
  Mat local_5b8 [16];
  long local_5a8;
  long *local_570;
  Mat local_558 [16];
  long local_548;
  long *local_510;
  Mat local_4f8 [96];
  Mat local_498 [96];
  _OutputArray local_438 [14];
  undefined4 local_2d8 [2];
  Mat *local_2d0;
  undefined8 local_2c8;
  Mat local_278 [96];
  Mat local_218 [104];
  Mat local_1b0 [96];
  Mat local_150 [96];
  Mat local_f0 [96];
  Mat local_90 [96];
  
switchD_0010a175_caseD_5:
  iVar8 = transformtype;
  pMVar14 = map_x;
  pMVar12 = map_y;
  map_y = (Mat *)map2y;
  map_x = (Mat *)map2x;
  transformtype = 1;
  switch(iVar8) {
  case 1:
    iVar8 = *(int *)(pMVar14 + 8);
    iVar11 = *(int *)(pMVar14 + 0xc);
    iVar3 = iVar11 / 2;
    iVar4 = iVar8 / 2;
    iVar5 = iVar4 + -1;
    fVar25 = (float)((angley * -3.141592653589793) / 180.0);
    fVar24 = (float)((anglex * -3.141592653589793) / 180.0);
    for (lVar15 = 0; lVar15 < iVar8; lVar15 = lVar15 + 1) {
      fVar16 = (float)((int)lVar15 - iVar5) / (float)iVar4;
      for (lVar10 = 0; lVar10 < iVar11; lVar10 = lVar10 + 1) {
        fVar17 = (float)((1 - iVar3) + (int)lVar10) / (float)iVar3;
        fVar22 = atan2f(fVar16,fVar17);
        fVar17 = SQRT(fVar17 * fVar17 + fVar16 * fVar16) * 3.1415927 * 0.5;
        fVar18 = sinf(fVar17);
        fVar19 = cosf(fVar22);
        fVar20 = sinf(fVar17);
        fVar22 = sinf(fVar22);
        fVar22 = fVar22 * fVar20;
        fVar19 = fVar19 * fVar18;
        local_748 = cosf(fVar17);
        if (anglex != 0.0 || angley != 0.0) {
          fVar17 = cosf(fVar25);
          fVar18 = sinf(fVar25);
          fVar21 = fVar17 * fVar22 - fVar18 * local_748;
          fVar17 = sinf(fVar25);
          fVar18 = cosf(fVar25);
          local_748 = fVar17 * fVar22 + fVar18 * local_748;
          fVar17 = cosf(fVar24);
          fVar18 = sinf(fVar24);
          fVar22 = sinf(fVar24);
          fVar20 = cosf(fVar24);
          fVar22 = fVar19 * fVar22 + fVar20 * fVar21;
          fVar19 = fVar19 * fVar17 + -fVar18 * fVar21;
        }
        fVar17 = atan2f(fVar22,fVar19);
        fVar22 = atan2f(local_748,SQRT(fVar19 * fVar19 + fVar22 * fVar22));
        iVar11 = *(int *)(pMVar14 + 0xc);
        *(float *)(**(long **)(pMVar14 + 0x48) * lVar15 + *(long *)(pMVar14 + 0x10) + lVar10 * 4) =
             ABS((float)iVar11 * (fVar17 / 3.1415927) * 0.5 + (float)(iVar3 + -1));
        iVar8 = *(int *)(pMVar14 + 8);
        *(float *)(**(long **)(pMVar12 + 0x48) * lVar15 + *(long *)(pMVar12 + 0x10) + lVar10 * 4) =
             (float)iVar8 * ((fVar22 + fVar22) / 3.1415927) * 0.5 + (float)iVar5;
      }
    }
    break;
  case 2:
    iVar8 = *(int *)(pMVar14 + 8);
    iVar11 = *(int *)(pMVar14 + 0xc);
    iVar3 = iVar11 / 2;
    iVar4 = iVar8 / 2 + -1;
    fVar25 = (float)((angley * -3.141592653589793) / 180.0);
    fVar24 = (float)((anglex * -3.141592653589793) / 180.0);
    for (lVar15 = 0; lVar15 < iVar8; lVar15 = lVar15 + 1) {
      for (lVar10 = 0; lVar10 < iVar11; lVar10 = lVar10 + 1) {
        fVar16 = ((float)((1 - iVar3) + (int)lVar10) * 3.1415927) / (float)(iVar11 / 2);
        fVar22 = ((float)((int)lVar15 - iVar4) * 1.5707964) / (float)(iVar8 / 2);
        fVar17 = cosf(fVar22);
        fVar18 = cosf(fVar16);
        fVar19 = cosf(fVar22);
        fVar20 = sinf(fVar16);
        fVar20 = fVar20 * fVar19;
        fVar18 = fVar18 * fVar17;
        fVar16 = sinf(fVar22);
        if (anglex != 0.0 || angley != 0.0) {
          fVar22 = cosf(fVar25);
          fVar17 = sinf(fVar25);
          fVar21 = fVar22 * fVar20 - fVar17 * fVar16;
          fVar22 = sinf(fVar25);
          fVar17 = cosf(fVar25);
          fVar16 = fVar22 * fVar20 + fVar17 * fVar16;
          fVar22 = cosf(fVar24);
          fVar17 = sinf(fVar24);
          fVar19 = sinf(fVar24);
          fVar20 = cosf(fVar24);
          fVar20 = fVar18 * fVar19 + fVar20 * fVar21;
          fVar18 = fVar18 * fVar22 + -fVar17 * fVar21;
        }
        fVar22 = 0.0;
        if (((fVar16 != 0.0) || (NAN(fVar16))) ||
           ((fVar20 != 0.0 || (((NAN(fVar20) || (fVar18 != 0.0)) || (NAN(fVar18))))))) {
          fVar22 = atan2f(SQRT(fVar18 * fVar18 + fVar20 * fVar20),fVar16);
          fVar22 = (fVar22 + fVar22) / 6.2831855;
        }
        fVar17 = 0.0;
        if (((fVar16 != 0.0) || (NAN(fVar16))) || ((fVar18 != 0.0 || (NAN(fVar18))))) {
          fVar17 = atan2f(fVar20,fVar18);
        }
        fVar16 = cosf(fVar17);
        *(float *)(**(long **)(pMVar14 + 0x48) * lVar15 + *(long *)(pMVar14 + 0x10) + lVar10 * 4) =
             (float)*(int *)(pMVar14 + 0xc) * fVar16 * fVar22 * 0.5 + (float)(iVar3 + -1);
        fVar16 = sinf(fVar17);
        iVar8 = *(int *)(pMVar14 + 8);
        *(float *)(**(long **)(pMVar12 + 0x48) * lVar15 + *(long *)(pMVar12 + 0x10) + lVar10 * 4) =
             (float)iVar8 * fVar16 * fVar22 * 0.5 + (float)iVar4;
        iVar11 = *(int *)(pMVar14 + 0xc);
      }
    }
    break;
  case 3:
    iVar8 = *(int *)(pMVar14 + 8);
    iVar11 = *(int *)(pMVar14 + 0xc);
    iVar3 = iVar11 / 2;
    iVar4 = iVar8 / 2 + -1;
    fVar25 = (float)((angley * -3.141592653589793) / 180.0);
    fVar24 = (float)((anglex * -3.141592653589793) / 180.0);
    for (lVar15 = 0; lVar15 < iVar8; lVar15 = lVar15 + 1) {
      for (lVar10 = 0; lVar10 < iVar11; lVar10 = lVar10 + 1) {
        fVar16 = ((float)((1 - iVar3) + (int)lVar10) * 3.1415927) / (float)(iVar11 / 2);
        fVar22 = ((float)((int)lVar15 - iVar4) * 1.5707964) / (float)(iVar8 / 2);
        fVar17 = cosf(fVar22);
        fVar18 = cosf(fVar16);
        fVar19 = cosf(fVar22);
        fVar16 = sinf(fVar16);
        fVar16 = fVar16 * fVar19;
        fVar18 = fVar18 * fVar17;
        fVar22 = sinf(fVar22);
        if (anglex != 0.0 || angley != 0.0) {
          fVar17 = cosf(fVar25);
          fVar19 = sinf(fVar25);
          fVar21 = fVar17 * fVar16 - fVar19 * fVar22;
          fVar17 = sinf(fVar25);
          fVar19 = cosf(fVar25);
          fVar22 = fVar17 * fVar16 + fVar19 * fVar22;
          fVar17 = cosf(fVar24);
          fVar19 = sinf(fVar24);
          fVar16 = sinf(fVar24);
          fVar20 = cosf(fVar24);
          fVar16 = fVar18 * fVar16 + fVar20 * fVar21;
          fVar18 = fVar18 * fVar17 + -fVar19 * fVar21;
        }
        if ((((fVar22 != 0.0) || (fVar16 != 0.0)) || (fVar18 != 0.0)) || (NAN(fVar18))) {
          atan2f(SQRT(fVar18 * fVar18 + fVar22 * fVar22),fVar16);
        }
        if (((fVar22 != 0.0) || (fVar18 != 0.0)) || (NAN(fVar18))) {
          atan2f(fVar22,fVar18);
        }
        iVar11 = *(int *)(pMVar14 + 0xc);
        *(float *)(**(long **)(pMVar14 + 0x48) * lVar15 + *(long *)(pMVar14 + 0x10) + lVar10 * 4) =
             (float)(iVar3 + -1) - fVar18 * (float)iVar11 * 0.5;
        iVar8 = *(int *)(pMVar14 + 8);
        *(float *)(**(long **)(pMVar12 + 0x48) * lVar15 + *(long *)(pMVar12 + 0x10) + lVar10 * 4) =
             fVar16 * (float)iVar8 * 0.5 + (float)iVar4;
      }
    }
    break;
  case 4:
    cv::Mat::Mat(local_498);
    cv::Mat::Mat(local_4f8);
    cv::Mat::Mat(local_90);
    cv::Mat::Mat(local_f0);
    cv::Mat::Mat(local_618);
    cv::Mat::Mat(local_558);
    cv::Mat::Mat(local_5b8);
    cv::Mat::Mat(local_150);
    cv::Mat::Mat(local_1b0);
    cv::Mat::Mat((Mat *)local_678);
    std::__cxx11::string::string((string *)&local_6a8,(string *)&strpathtowarpfile_abi_cxx11_);
    ReadMesh(&local_6a8);
    std::__cxx11::string::~string((string *)&local_6a8);
    iVar11 = *(int *)(pMVar14 + 8) / (int)meshu._8_4_;
    iVar8 = *(int *)(pMVar14 + 0xc) / (int)meshu._12_4_;
    local_438[0].super__InputArray.sz.width = 0;
    local_438[0].super__InputArray.sz.height = 0;
    local_438[0].super__InputArray.flags = 0x1010000;
    local_438[0].super__InputArray.obj = meshu;
    local_2c8 = 0;
    local_2d8[0] = 0x2010000;
    local_680 = *(int *)(pMVar14 + 0xc) + iVar8;
    local_67c = *(int *)(pMVar14 + 8) + iVar11;
    local_2d0 = local_498;
    cv::resize(0x4000000000000000);
    local_438[0].super__InputArray.sz.width = 0;
    local_438[0].super__InputArray.sz.height = 0;
    local_438[0].super__InputArray.flags = 0x1010000;
    local_2c8 = 0;
    local_438[0].super__InputArray.obj = meshv;
    local_2d8[0] = 0x2010000;
    local_688 = iVar8 + *(int *)(pMVar14 + 0xc);
    local_684 = iVar11 + *(int *)(pMVar14 + 8);
    local_2d0 = local_4f8;
    cv::resize(0x4000000000000000);
    local_438[0].super__InputArray.sz.width = 0;
    local_438[0].super__InputArray.sz.height = 0;
    local_438[0].super__InputArray.flags = 0x1010000;
    local_2c8 = 0;
    local_438[0].super__InputArray.obj = meshi;
    local_2d8[0] = 0x2010000;
    local_2d0 = local_618;
    cv::resize(0x4000000000000000);
    cv::Mat::Mat((Mat *)local_2d8,local_618);
    cv::Mat::Mat(local_278,local_618);
    cv::Mat::Mat(local_218,local_618);
    local_438[0].super__InputArray.sz.width = 0;
    local_438[0].super__InputArray.sz.height = 0;
    local_438[0].super__InputArray.flags = 0x2010000;
    local_438[0].super__InputArray.obj = I;
    cv::merge((Mat *)local_2d8,3,local_438);
    cv::operator*((double)(*(int *)(pMVar14 + 0xc) + -1),(Mat *)local_438);
    (**(code **)(*(long *)CONCAT44(local_438[0].super__InputArray._4_4_,
                                   local_438[0].super__InputArray.flags) + 0x18))
              ((long *)CONCAT44(local_438[0].super__InputArray._4_4_,
                                local_438[0].super__InputArray.flags),local_438,local_678,
               0xffffffffffffffff);
    cv::MatExpr::~MatExpr((MatExpr *)local_438);
    local_438[0].super__InputArray.sz.width = 0;
    local_438[0].super__InputArray.sz.height = 0;
    local_438[0].super__InputArray.flags = 0x2010000;
    local_438[0].super__InputArray.obj = local_558;
    cv::Mat::convertTo(local_678,(int)local_438,1.0,0.0);
    cv::operator*((double)(*(int *)(pMVar14 + 8) + -1),(Mat *)local_438);
    (**(code **)(*(long *)CONCAT44(local_438[0].super__InputArray._4_4_,
                                   local_438[0].super__InputArray.flags) + 0x18))
              ((long *)CONCAT44(local_438[0].super__InputArray._4_4_,
                                local_438[0].super__InputArray.flags),local_438,local_678,
               0xffffffffffffffff);
    cv::MatExpr::~MatExpr((MatExpr *)local_438);
    local_438[0].super__InputArray.sz.width = 0;
    local_438[0].super__InputArray.sz.height = 0;
    local_438[0].super__InputArray.flags = 0x2010000;
    local_438[0].super__InputArray.obj = local_5b8;
    cv::Mat::convertTo(local_678,(int)local_438,1.0,0.0);
    uVar1 = *(uint *)(pMVar14 + 8);
    uVar2 = *(uint *)(pMVar14 + 0xc);
    uVar7 = 0;
    uVar13 = (ulong)uVar2;
    if ((int)uVar2 < 1) {
      uVar13 = uVar7;
    }
    lVar15 = (long)(int)((long)((ulong)(uint)((int)((long)(int)uVar1 / (long)(int)meshu._8_4_) >>
                                             0x1f) << 0x20 |
                               (long)(int)uVar1 / (long)(int)meshu._8_4_ & 0xffffffffU) / 2);
    uVar6 = (ulong)uVar1;
    if ((int)uVar1 < 1) {
      uVar6 = uVar7;
    }
    lVar10 = (long)(int)((long)((ulong)(uint)((int)((long)(int)uVar2 / (long)(int)meshu._12_4_) >>
                                             0x1f) << 0x20 |
                               (long)(int)uVar2 / (long)(int)meshu._12_4_ & 0xffffffffU) / 2) * 4;
    for (; uVar7 != uVar6; uVar7 = uVar7 + 1) {
      for (uVar9 = 0; uVar13 != uVar9; uVar9 = uVar9 + 1) {
        *(float *)(**(long **)(pMVar14 + 0x48) * uVar7 + *(long *)(pMVar14 + 0x10) + uVar9 * 4) =
             (float)*(int *)(*local_510 * lVar15 + local_548 + lVar10 + uVar9 * 4);
        *(float *)(**(long **)(pMVar12 + 0x48) * uVar7 + *(long *)(pMVar12 + 0x10) + uVar9 * 4) =
             (float)*(int *)(*local_570 * lVar15 + local_5a8 + lVar10 + uVar9 * 4);
      }
      lVar15 = lVar15 + 1;
    }
    lVar15 = 0xc0;
    do {
      cv::Mat::~Mat((Mat *)((long)local_2d8 + lVar15));
      lVar15 = lVar15 + -0x60;
    } while (lVar15 != -0x60);
    cv::Mat::~Mat((Mat *)local_678);
    cv::Mat::~Mat(local_1b0);
    cv::Mat::~Mat(local_150);
    cv::Mat::~Mat(local_5b8);
    cv::Mat::~Mat(local_558);
    cv::Mat::~Mat(local_618);
    cv::Mat::~Mat(local_f0);
    cv::Mat::~Mat(local_90);
    cv::Mat::~Mat(local_4f8);
    cv::Mat::~Mat(local_498);
    break;
  case 5:
    goto switchD_0010a175_caseD_5;
  default:
    iVar8 = *(int *)(pMVar14 + 8);
    iVar11 = *(int *)(pMVar14 + 0xc);
    iVar3 = iVar11 / 2;
    iVar4 = iVar8 / 2;
    iVar5 = iVar4 + -1;
    fVar25 = (float)((angley * -3.141592653589793) / 180.0);
    fVar24 = (float)((anglex * -3.141592653589793) / 180.0);
    for (lVar15 = 0; lVar15 < iVar8; lVar15 = lVar15 + 1) {
      fVar16 = (float)((int)lVar15 - iVar5) / (float)iVar4;
      for (lVar10 = 0; lVar10 < iVar11; lVar10 = lVar10 + 1) {
        fVar22 = (float)((1 - iVar3) + (int)lVar10) / (float)iVar3;
        fVar17 = SQRT(fVar22 * fVar22 + fVar16 * fVar16);
        fVar18 = atan2f(fVar16,fVar22);
        fVar19 = fVar17 * 6.2831855 * 0.5;
        fVar20 = sinf(fVar19);
        fVar22 = cosf(fVar18);
        fVar22 = fVar22 * fVar20;
        fVar20 = sinf(fVar19);
        fVar18 = sinf(fVar18);
        fVar18 = fVar18 * fVar20;
        local_760 = cosf(fVar19);
        if (anglex != 0.0 || angley != 0.0) {
          fVar19 = cosf(fVar25);
          fVar20 = sinf(fVar25);
          fVar23 = fVar19 * fVar18 - fVar20 * local_760;
          fVar19 = sinf(fVar25);
          fVar20 = cosf(fVar25);
          local_760 = fVar19 * fVar18 + fVar20 * local_760;
          fVar19 = cosf(fVar24);
          fVar20 = sinf(fVar24);
          fVar18 = sinf(fVar24);
          fVar21 = cosf(fVar24);
          fVar18 = fVar18 * fVar22 + fVar21 * fVar23;
          fVar22 = fVar19 * fVar22 - fVar20 * fVar23;
        }
        fVar19 = atan2f(fVar18,fVar22);
        fVar22 = atan2f(local_760,SQRT(fVar22 * fVar22 + fVar18 * fVar18));
        iVar11 = *(int *)(pMVar14 + 0xc);
        if (fVar17 <= 1.1) {
          *(float *)(**(long **)(pMVar14 + 0x48) * lVar15 + *(long *)(pMVar14 + 0x10) + lVar10 * 4)
               = ABS((float)iVar11 * (fVar19 / 3.1415927) * 0.5 + (float)(iVar3 + -1));
          *(float *)(**(long **)(pMVar12 + 0x48) * lVar15 + *(long *)(pMVar12 + 0x10) + lVar10 * 4)
               = (float)*(int *)(pMVar14 + 8) * ((fVar22 + fVar22) / 3.1415927) * 0.5 + (float)iVar5
          ;
        }
      }
      iVar8 = *(int *)(pMVar14 + 8);
    }
  }
  return;
}

Assistant:

void update_map( double anglex, double angley, Mat &map_x, Mat &map_y, int transformtype )
{
	// explanation comments are most verbose in the last 
	// default (transformtype == 0) section
	switch (transformtype)
	{
	case 5: // 360 to 180 fisheye and then to warped
	//if (transformtype == 5)	
	{
		// create temp maps to the texture and then map from texture to output
		// this will need 2 remaps at the output side
		// and two sets of map files
		
		// the map file for the first remap has to change with change of anglex angley
		// the second one, for fisheye to warped, doesn't need to be recalculated.
		
		// so, update_map is called first to initialize map_x and map_y
		// using transformtype = 4
		
		// and later, and at all other times, only the map to the texture is updated.
		
		update_map( anglex, angley, map2x, map2y, 1 );
		
	}
		break;
		
	case 4:
	//if (transformtype == 4)	//  fisheye to warped
	{
		// similar to TGAWarp at http://paulbourke.net/dome/tgawarp/
		//
		
		Mat U, V, X, Y, IC1;
		Mat indexu, indexv, indexx, indexy, temp;
		ReadMesh(strpathtowarpfile);
		//resize(meshx, X, map_x.size(), INTER_LINEAR);
		//resize(meshy, Y, map_x.size(), INTER_LINEAR);
		//debug - changed INTER_LINEAR to INTER_LANCZOS4 and later INTER_CUBIC
		// not much of a penalty, so we leave it in.
		
		// discard the top/bottom line of U and V, since they cause
		// the bottom of the image to be repeats of the same
		//~ Mat meshub, meshvb;
		//~ meshu(cv::Rect(0,0,meshu.cols,(meshu.rows-1))).copyTo(meshub);
		//~ meshv(cv::Rect(0,0,meshv.cols,(meshv.rows-1))).copyTo(meshvb);
		// this doesn't work
		
		// for per pixel equivalence with GL_warp, the following seems to be needed
		int extrarows = map_x.rows / meshu.rows ;
		int extracols = map_x.cols / meshu.cols;
		resize(meshu, U, Size(map_x.cols+extracols, (map_x.rows+extrarows)), INTER_CUBIC);
		resize(meshv, V, Size(map_x.cols+extracols, (map_x.rows+extrarows)), INTER_CUBIC);
		
		//resize(meshu, U, map_x.size(), INTER_CUBIC);
		//resize(meshv, V, map_x.size(), INTER_CUBIC);
		resize(meshi, IC1, map_x.size(), INTER_CUBIC);
		
		// I.convertTo(I, CV_32FC3); //this doesn't work 	
		//convert to 3 channel Mat, for later multiplication
		// https://stackoverflow.com/questions/23303305/opencv-element-wise-matrix-multiplication/23310109
		Mat t[] = {IC1, IC1, IC1};
		merge(t, 3, I);
		
		// map the values which are [minx,maxx] to [0,map_x.cols-1]
		//~ temp = (map_x.cols-1)*(X - minx)/(maxx-minx);
		//~ temp.convertTo(indexx, CV_32S);		// this does the rounding to int
		
		//~ temp = (map_x.rows-1)*(Y+1)/2;	// assuming miny=-1, maxy=1
		//~ temp.convertTo(indexy, CV_32S);
		
		temp = (map_x.cols-1)*U;	// assuming minu=0, maxu=1
		temp.convertTo(indexu, CV_32S);		// this does the rounding to int
		
		temp = (map_x.rows-1)*V;	// assuming minv=0, maxv=1
		//~ temp = (map_x.rows)*(V-minv)/(maxv-minv);
		temp.convertTo(indexv, CV_32S);
		
		int linestodiscard = map_x.rows / meshu.rows / 2;
		int colstodiscard = map_x.cols / meshu.cols / 2;
		
		for ( int i = 0; i < (map_x.rows); i++ ) // here, i is for y and j is for x
			{
				for ( int j = 0; j < map_x.cols; j++ )
				{
					//~ map_x.at<float>(i, j) = (float)(j); // this just maps input to output
				    //~ map_y.at<float>(i, j) = (float)(i); 
				    
				    // in the following, we assume indexx.at<int>(i,j) = j
				    // and indexy.at<int>(i,j) = i
				    // otherwise, a mesh effect due to discontinuities in indexx and indexy.
				    	
					map_x.at<float>(i,j) = (float) indexu.at<int>(i+linestodiscard,j+colstodiscard);
					map_y.at<float>(i,j) = (float) indexv.at<int>(i+linestodiscard,j+colstodiscard);
					
				} //end for j
			} //end for i
		return;
	}
	break;
		
	case 3:
	//if (transformtype == 3)	//  fisheye to Equirectangular - dual output - using parallel projection
	{
		// int xcd = floor(map_x.cols/2) - 1 + anglex;	// this just 'pans' the view
		// int ycd = floor(map_x.rows/2) - 1 + angley;
		int xcd = floor(map_x.cols/2) - 1 ;
		int ycd = floor(map_x.rows/2) - 1 ;
		 
		float px_per_theta = map_x.cols * 2 / (2*CV_PI); 	// src width = map_x.cols * 2
		float px_per_phi   = map_x.rows / CV_PI;			// src height = PI for equirect 360
		float rad_per_px = CV_PI / map_x.rows;
		float theta;
		float longi, lat, Px, Py, Pz, R;						// X and Y are map_x and map_y
		float PxR, PyR, PzR;
		float aperture = CV_PI;	// this is the only change between type 2 & 3
		float angleyrad = -angley*CV_PI/180;	// made these minus for more intuitive feel
		float anglexrad = -anglex*CV_PI/180;
		
		
		for ( int i = 0; i < map_x.rows; i++ ) // here, i is for y and j is for x
			{
				for ( int j = 0; j < map_x.cols; j++ )
				{
					longi 	= (CV_PI    ) * (j - xcd) / (map_x.cols/2);		// longi = x.pi for 360 image
					lat	 	= (CV_PI / 2) * (i - ycd) / (map_x.rows/2);		// lat = y.pi/2
					
					Px = cos(lat)*cos(longi);
					Py = cos(lat)*sin(longi);
					Pz = sin(lat);
					
					if(angley!=0 || anglex!=0)
					{
						// cos(angleyrad), 0, sin(angleyrad), 0, 1, 0, -sin(angleyrad), 0, cos(angleyrad));
						
						PxR = Px;
						PyR = cos(angleyrad) * Py - sin(angleyrad) * Pz;
						PzR = sin(angleyrad) * Py + cos(angleyrad) * Pz;
						
						Px = cos(anglexrad) * PxR - sin(anglexrad) * PyR;
						Py = sin(anglexrad) * PxR + cos(anglexrad) * PyR;
						Pz = PzR;
					}
					
					
					if (Px == 0 && Py == 0 && Pz == 0)
						R = 0;
					else 
						R = 2 * atan2(sqrt(Px*Px + Pz*Pz), Py) / aperture; 	
					
					if (Px == 0 && Pz ==0)
						theta = 0;
					else
						theta = atan2(Pz, Px);
						
					
					// map_x.at<float>(i, j) = R * cos(theta); this maps to [-1, 1]
					//map_x.at<float>(i, j) = R * cos(theta) * map_x.cols / 2 + xcd;
					map_x.at<float>(i, j) = - Px * map_x.cols / 2 + xcd;
					
					// this gives two copies in final output, top one reasonably correct
					
					// map_y.at<float>(i, j) = R * sin(theta); this maps to [-1, 1]
					//map_y.at<float>(i, j) = R * sin(theta) * map_x.rows / 2 + ycd;
					map_y.at<float>(i, j) = Py * map_x.rows / 2 + ycd;
					
				 } // for j
				   
			} // for i
			
	}
	break;
	
	case 2:
	//if (transformtype == 2)	// 360 degree fisheye to Equirectangular 360 
	{
		// int xcd = floor(map_x.cols/2) - 1 + anglex;	// this just 'pans' the view
		// int ycd = floor(map_x.rows/2) - 1 + angley;
		int xcd = floor(map_x.cols/2) - 1 ;
		int ycd = floor(map_x.rows/2) - 1 ;
		 
		float px_per_theta = map_x.cols  / (2*CV_PI); 	//  width = map_x.cols 
		float px_per_phi   = map_x.rows / CV_PI;		//  height = PI for equirect 360
		float rad_per_px = CV_PI / map_x.rows;
		float theta;
		float longi, lat, Px, Py, Pz, R;						// X and Y are map_x and map_y
		float PxR, PyR, PzR;
		float aperture = 2*CV_PI;
		float angleyrad = -angley*CV_PI/180;	// made these minus for more intuitive feel
		float anglexrad = -anglex*CV_PI/180;
		
		for ( int i = 0; i < map_x.rows; i++ ) // here, i is for y and j is for x
			{
				for ( int j = 0; j < map_x.cols; j++ )
				{
					longi 	= (CV_PI    ) * (j - xcd) / (map_x.cols/2);		// longi = x.pi for 360 image
					lat	 	= (CV_PI / 2) * (i - ycd) / (map_x.rows/2);		// lat = y.pi/2
					
					Px = cos(lat)*cos(longi);
					Py = cos(lat)*sin(longi);
					Pz = sin(lat);
					
					if(angley!=0 || anglex!=0)
					{
						// cos(angleyrad), 0, sin(angleyrad), 0, 1, 0, -sin(angleyrad), 0, cos(angleyrad));
						
						PxR = Px;
						PyR = cos(angleyrad) * Py - sin(angleyrad) * Pz;
						PzR = sin(angleyrad) * Py + cos(angleyrad) * Pz;
						
						Px = cos(anglexrad) * PxR - sin(anglexrad) * PyR;
						Py = sin(anglexrad) * PxR + cos(anglexrad) * PyR;
						Pz = PzR;
					}
					
					
					if (Px == 0 && Py == 0 && Pz == 0)
						R = 0;
					else 
						R = 2 * atan2(sqrt(Px*Px + Py*Py), Pz) / aperture; 
						// exchanged Py and Pz from Paul's co-ords, 	
						// from Perspective projection the wrong imaging model 10.1.1.52.8827.pdf
						// http://citeseerx.ist.psu.edu/viewdoc/download?doi=10.1.1.52.8827&rep=rep1&type=pdf
						// Or else, Africa ends up sideways, and with the far east and west streched out on top and bottom
					
					if (Px == 0 && Pz ==0)
						theta = 0;
					else
						theta = atan2(Py, Px);
						
					
					// map_x.at<float>(i, j) = R * cos(theta); this maps to [-1, 1]
					map_x.at<float>(i, j) =  R * cos(theta) * map_x.cols / 2 + xcd;
					
					// currently upside down 
					
					// map_y.at<float>(i, j) = R * sin(theta); this maps to [-1, 1]
					map_y.at<float>(i, j) =  R * sin(theta) * map_x.rows / 2 + ycd;
					
					
				 } // for j
				   
			} // for i
			
	}
	break;
	
	case 1:
	//if (transformtype == 1)	// Equirectangular 360 to 180 degree fisheye
	{
		// using the transformations at
		// http://paulbourke.net/dome/dualfish2sphere/diagram.pdf
		int xcd = floor(map_x.cols/2) - 1 ;
		int ycd = floor(map_x.rows/2) - 1 ;
		float halfcols = map_x.cols/2;
		float halfrows = map_x.rows/2;
		
		
		float longi, lat, Px, Py, Pz, theta;						// X and Y are map_x and map_y
		float xfish, yfish, rfish, phi, xequi, yequi;
		float PxR, PyR, PzR;
		float aperture = CV_PI;
		float angleyrad = -angley*CV_PI/180;	// made these minus for more intuitive feel
		float anglexrad = -anglex*CV_PI/180;
		
		//Mat inputmatrix, rotationmatrix, outputmatrix;
		// https://en.wikipedia.org/wiki/Rotation_matrix#Basic_rotations
		//rotationmatrix = (Mat_<float>(3,3) << cos(angleyrad), 0, sin(angleyrad), 0, 1, 0, -sin(angleyrad), 0, cos(angleyrad)); //y
		//rotationmatrix = (Mat_<float>(3,3) << 1, 0, 0, 0, cos(angleyrad), -sin(angleyrad), 0, sin(angleyrad), cos(angleyrad)); //x
		//rotationmatrix = (Mat_<float>(3,3) << cos(angleyrad), -sin(angleyrad), 0, sin(angleyrad), cos(angleyrad), 0, 0, 0, 1); //z
		
		for ( int i = 0; i < map_x.rows; i++ ) // here, i is for y and j is for x
			{
				for ( int j = 0; j < map_x.cols; j++ )
				{
					// normalizing to [-1, 1]
					xfish = (j - xcd) / halfcols;
					yfish = (i - ycd) / halfrows;
					rfish = sqrt(xfish*xfish + yfish*yfish);
					theta = atan2(yfish, xfish);
					phi = rfish*aperture/2;
					
					// Paul's co-ords - this is suitable when phi=0 is Pz=0
					
					//Px = cos(phi)*cos(theta);
					//Py = cos(phi)*sin(theta);
					//Pz = sin(phi);
					
					// standard co-ords - this is suitable when phi=pi/2 is Pz=0
					Px = sin(phi)*cos(theta);
					Py = sin(phi)*sin(theta);
					Pz = cos(phi);
					
					if(angley!=0 || anglex!=0)
					{
						// cos(angleyrad), 0, sin(angleyrad), 0, 1, 0, -sin(angleyrad), 0, cos(angleyrad));
						
						PxR = Px;
						PyR = cos(angleyrad) * Py - sin(angleyrad) * Pz;
						PzR = sin(angleyrad) * Py + cos(angleyrad) * Pz;
						
						Px = cos(anglexrad) * PxR - sin(anglexrad) * PyR;
						Py = sin(anglexrad) * PxR + cos(anglexrad) * PyR;
						Pz = PzR;
					}
					
					
					longi 	= atan2(Py, Px);
					lat	 	= atan2(Pz,sqrt(Px*Px + Py*Py));	
					// this gives south pole centred, ie yequi goes from [-1, 0]
					// Made into north pole centred by - (minus) in the final map_y assignment
					
					xequi = longi / CV_PI;
					// this maps to [-1, 1]
					yequi = 2*lat / CV_PI;
					// this maps to [-1, 0] for south pole
					
					//if (rfish <= 1.0)		// outside that circle, let it be black
					// removed the black circle to help transformtype=5
					// avoid bottom pixels black
					{
						map_x.at<float>(i, j) =  abs(xequi * map_x.cols / 2 + xcd);
						//map_y.at<float>(i, j) =  yequi * map_x.rows / 2 + ycd;
						// this gets south pole centred view
						
						// the abs is to correct for -0.5 xequi value at longi=0
						
						map_y.at<float>(i, j) =  yequi * map_x.rows / 2 + ycd;
						//debug
						//~ if (rfish <= 1.0/500)
						//if ((longi==0)||(longi==CV_PI)||(longi==-CV_PI))
						//if (lat==0)	// since these are floats, probably doesn't work
						//~ {
							//~ std::cout << "i,j,mapx,mapy=";
							//~ std::cout << i << ", ";
							//~ std::cout << j << ", ";
							//~ std::cout << map_x.at<float>(i, j) << ", ";
							//~ std::cout << map_y.at<float>(i, j) << std::endl;
						//~ }
					}
					
				 } // for j
				   
			} // for i
			
	}
	break;
	
	case 0:
	default:
	//else
	//if (transformtype == 0) // the default // Equirectangular 360 to 360 degree fisheye
	{
			
		//////////////////////////////////////
		// the following code is similar to transformtype=1 code
		// with only the "aperture" changed to 2pi	
		int xcd = floor(map_x.cols/2) - 1 ;
		int ycd = floor(map_x.rows/2) - 1 ;
		float halfcols = map_x.cols/2;
		float halfrows = map_x.rows/2;
		
		
		float longi, lat, Px, Py, Pz, theta;						// X and Y are map_x and map_y
		float xfish, yfish, rfish, phi, xequi, yequi;
		float PxR, PyR, PzR;
		float aperture = 2*CV_PI;
		float angleyrad = -angley*CV_PI/180;	// made these minus for more intuitive feel
		float anglexrad = -anglex*CV_PI/180;
		
		//Mat inputmatrix, rotationmatrix, outputmatrix;
		// https://en.wikipedia.org/wiki/Rotation_matrix#Basic_rotations
		//rotationmatrix = (Mat_<float>(3,3) << cos(angleyrad), 0, sin(angleyrad), 0, 1, 0, -sin(angleyrad), 0, cos(angleyrad)); //y
		//rotationmatrix = (Mat_<float>(3,3) << 1, 0, 0, 0, cos(angleyrad), -sin(angleyrad), 0, sin(angleyrad), cos(angleyrad)); //x
		//rotationmatrix = (Mat_<float>(3,3) << cos(angleyrad), -sin(angleyrad), 0, sin(angleyrad), cos(angleyrad), 0, 0, 0, 1); //z
		
		for ( int i = 0; i < map_x.rows; i++ ) // here, i is for y and j is for x
			{
				for ( int j = 0; j < map_x.cols; j++ )
				{
					// normalizing to [-1, 1]
					xfish = (j - xcd) / halfcols;
					yfish = (i - ycd) / halfrows;
					rfish = sqrt(xfish*xfish + yfish*yfish);
					theta = atan2(yfish, xfish);
					phi = rfish*aperture/2;
					
					// Paul's co-ords - this is suitable when phi=0 is Pz=0
					
					//Px = cos(phi)*cos(theta);
					//Py = cos(phi)*sin(theta);
					//Pz = sin(phi);
					
					// standard co-ords - this is suitable when phi=pi/2 is Pz=0
					Px = sin(phi)*cos(theta);
					Py = sin(phi)*sin(theta);
					Pz = cos(phi);
					
					if(angley!=0 || anglex!=0)
					{
						// cos(angleyrad), 0, sin(angleyrad), 0, 1, 0, -sin(angleyrad), 0, cos(angleyrad));
						
						PxR = Px;
						PyR = cos(angleyrad) * Py - sin(angleyrad) * Pz;
						PzR = sin(angleyrad) * Py + cos(angleyrad) * Pz;
						
						Px = cos(anglexrad) * PxR - sin(anglexrad) * PyR;
						Py = sin(anglexrad) * PxR + cos(anglexrad) * PyR;
						Pz = PzR;
					}
					
					
					longi 	= atan2(Py, Px);
					lat	 	= atan2(Pz,sqrt(Px*Px + Py*Py));	
					// this gives south pole centred, ie yequi goes from [-1, 0]
					// Made into north pole centred by - (minus) in the final map_y assignment
					
					xequi = longi / CV_PI;
					// this maps to [-1, 1]
					yequi = 2*lat / CV_PI;
					// this maps to [-1, 0] for south pole
					
					if (rfish <= 1.1)		// outside that circle, let it be black
					// restored the black circle 
					// to help transformtype=5
					// avoid bottom pixels black, made it 1.1 instead of 1.0
					{
						map_x.at<float>(i, j) =  abs(xequi * map_x.cols / 2 + xcd);
						//map_y.at<float>(i, j) =  yequi * map_x.rows / 2 + ycd;
						// this gets south pole centred view
						
						// the abs is to correct for -0.5 xequi value at longi=0
						
						map_y.at<float>(i, j) =  yequi * map_x.rows / 2 + ycd;
						
					}
					
				 } // for j
				   
			} // for i
	 
     } // end of if transformtype == 0
	}	// end switch case
    
}